

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgd-walk.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  nettlp *__buf;
  uintptr_t *puVar2;
  uint16_t devn;
  uint16_t busn;
  uintptr_t vaddr;
  uintptr_t addr;
  nettlp nt;
  task_struct t;
  ushort local_120;
  short local_11e;
  int local_11c;
  uintptr_t local_118;
  uintptr_t local_110;
  nettlp local_108;
  task_struct local_f0;
  
  local_108.remote_addr.s_addr = 0;
  local_108.local_addr.s_addr = 0;
  local_108.requester = 0;
  local_108.tag = '\0';
  local_108._11_1_ = 0;
  local_108.dir = DMA_ISSUED_BY_LIBTLP;
  local_108.sockfd = 0;
  local_108.port = 0;
  local_108._22_2_ = 0;
  local_110 = 0;
  local_11e = 0;
  local_120 = 0;
  local_118 = 0;
  local_11c = -1;
LAB_00102cd8:
  do {
    while (iVar1 = getopt(argc,argv,"r:l:b:t:a:p:v:"), iVar1 < 0x6c) {
      if (iVar1 == 0x61) {
        puVar2 = &local_110;
LAB_00102d99:
        __isoc99_sscanf(_optarg,"0x%lx",puVar2);
      }
      else {
        if (iVar1 != 0x62) {
          if (iVar1 == -1) {
            iVar1 = nettlp_init(&local_108);
            if (iVar1 < 0) {
              perror("nettlp_init");
              return iVar1;
            }
            fill_task_struct(&local_108,local_110,&local_f0);
            task(&local_108,local_f0.vhead,local_f0.vchildren,local_11c,local_118);
            return 0;
          }
          goto switchD_00102cfd_caseD_6d;
        }
        __isoc99_sscanf(_optarg,"%hx:%hx",&local_11e,&local_120);
        local_108.requester = local_11e << 8 | local_120;
      }
    }
    switch(iVar1) {
    case 0x6c:
      __buf = (nettlp *)&local_108.local_addr;
      break;
    default:
switchD_00102cfd_caseD_6d:
      puts(
          "usage\n    -r remote addr\n    -l local addr\n    -b bus number, XX:XX\n    -t tag\n    -a virtual address of the first task_struct\n    -p pid\n    -v virtual address to be shown"
          );
      return -1;
    case 0x70:
      local_11c = atoi(_optarg);
      goto LAB_00102cd8;
    case 0x72:
      __buf = &local_108;
      break;
    case 0x74:
      iVar1 = atoi(_optarg);
      local_108.tag = (uint8_t)iVar1;
      goto LAB_00102cd8;
    case 0x76:
      puVar2 = &local_118;
      goto LAB_00102d99;
    }
    iVar1 = inet_pton(2,_optarg,__buf);
    if (iVar1 < 1) {
      perror("inet_pton");
      return -1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, pid;
	struct nettlp nt;
	uintptr_t addr, vaddr;
	uint16_t busn, devn;
	struct task_struct t;

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;
	pid = -1;	/* not mached */
	vaddr = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:p:v:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'p':
			pid = atoi(optarg);
			break;

		case 'v':
			ret = sscanf(optarg, "0x%lx", &vaddr);
			break;

		default :
			usage();
			return -1;
		}
	}


	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}

	fill_task_struct(&nt, addr, &t);

	task(&nt, t.vhead, t.vchildren, pid, vaddr);
	//print_task_struct(&nt, t);
	//dump_task_struct(&t);

	return 0;
}